

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O0

void pnga_pgroup_brdcst(Integer grp_id,Integer type,void *buf,Integer len,Integer originator)

{
  void *in_RCX;
  ARMCI_Group *in_RDI;
  undefined8 in_R8;
  int unaff_retaddr;
  int aroot_1;
  int aroot;
  int p_grp;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if ((int)in_RDI < 1) {
    armci_msg_bcast(in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8);
  }
  else {
    armci_msg_group_bcast_scope(originator._4_4_,_aroot,aroot_1,unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void pnga_pgroup_brdcst(Integer grp_id, Integer type, void *buf,
                             Integer len, Integer originator)
{
    int p_grp = (int)grp_id;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if (p_grp > 0) {
#ifdef MSG_COMMS_MPI
       int aroot = PGRP_LIST[p_grp].inv_map_proc_list[originator];
       armci_msg_group_bcast_scope(SCOPE_ALL,buf,(int)len,aroot,(&(PGRP_LIST[p_grp].group)));
#endif
    } else {
       int aroot = (int)originator;
       armci_msg_bcast(buf, (int)len, (int)aroot);
    }
}